

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.h
# Opt level: O2

void __thiscall
interfaces::Ipc::addCleanup<interfaces::Echo>(Ipc *this,Echo *iface,function<void_()> cleanup)

{
  long lVar1;
  undefined8 *in_RDX;
  long in_FS_OFFSET;
  _Any_data local_38;
  long local_28;
  undefined8 local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_28 = 0;
  local_20 = in_RDX[3];
  lVar1 = in_RDX[2];
  if (lVar1 != 0) {
    local_38._M_unused._0_8_ = (undefined8)*in_RDX;
    local_38._8_8_ = in_RDX[1];
    in_RDX[2] = 0;
    in_RDX[3] = 0;
    local_28 = lVar1;
  }
  (**(code **)(*(long *)this + 0x28))(this,&Echo::typeinfo,iface,&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void addCleanup(Interface& iface, std::function<void()> cleanup)
    {
        addCleanup(typeid(Interface), &iface, std::move(cleanup));
    }